

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1da1d1::ReferenceType::printRight(ReferenceType *this,OutputStream *s)

{
  bool bVar1;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar2;
  StringView local_48;
  ReferenceKind local_38;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> Collapsed;
  SwapAndRestore<bool> SavePrinting;
  OutputStream *s_local;
  ReferenceType *this_local;
  
  if ((this->Printing & 1U) == 0) {
    SwapAndRestore<bool>::SwapAndRestore
              ((SwapAndRestore<bool> *)&Collapsed.second,&this->Printing,true);
    pVar2 = collapse(this,s);
    Collapsed._0_8_ = pVar2.second;
    local_38 = pVar2.first;
    bVar1 = Node::hasArray((Node *)Collapsed._0_8_,s);
    if ((bVar1) || (bVar1 = Node::hasFunction((Node *)Collapsed._0_8_,s), bVar1)) {
      StringView::StringView(&local_48,")");
      OutputStream::operator+=(s,local_48);
    }
    (**(code **)(*(long *)Collapsed._0_8_ + 0x28))(Collapsed._0_8_,s);
    SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)&Collapsed.second);
  }
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += ")";
    Collapsed.second->printRight(s);
  }